

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  char *local_b0;
  xml_node local_a0;
  xml_attribute local_98;
  xpath_node local_90;
  xml_node local_80;
  xml_attribute local_78;
  xpath_node local_70;
  xml_node local_60;
  xml_attribute local_58;
  xpath_node local_50;
  char_t *local_40;
  char_t *name;
  xpath_allocator *alloc_local;
  xml_node_struct *parent_local;
  xml_attribute_struct *a_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  name = (char_t *)alloc;
  alloc_local = (xpath_allocator *)parent;
  parent_local = (xml_node_struct *)a;
  a_local = (xml_attribute_struct *)ns;
  ns_local = (xpath_node_set_raw *)this;
  if (a == (xml_attribute_struct *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x2715,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_attribute_struct *, xml_node_struct *, xpath_allocator *)"
                 );
  }
  if (a->name == (char_t *)0x0) {
    local_b0 = "";
  }
  else {
    local_b0 = a->name;
  }
  local_40 = local_b0;
  switch(this->_test) {
  case '\x01':
    bVar2 = strequal(local_b0,(this->_data).string);
    if ((bVar2) && (bVar2 = is_xpath_attribute(local_40), pxVar1 = a_local, bVar2)) {
      xml_attribute::xml_attribute(&local_58,(xml_attribute_struct *)parent_local);
      xml_node::xml_node(&local_60,(xml_node_struct *)alloc_local);
      xpath_node::xpath_node(&local_50,&local_58,&local_60);
      xpath_node_set_raw::push_back((xpath_node_set_raw *)pxVar1,&local_50,(xpath_allocator *)name);
      return true;
    }
    break;
  case '\x02':
  case '\a':
    bVar2 = is_xpath_attribute(local_b0);
    pxVar1 = a_local;
    if (bVar2) {
      xml_attribute::xml_attribute(&local_78,(xml_attribute_struct *)parent_local);
      xml_node::xml_node(&local_80,(xml_node_struct *)alloc_local);
      xpath_node::xpath_node(&local_70,&local_78,&local_80);
      xpath_node_set_raw::push_back((xpath_node_set_raw *)pxVar1,&local_70,(xpath_allocator *)name);
      return true;
    }
    break;
  default:
    break;
  case '\b':
    bVar2 = starts_with(local_b0,(this->_data).string);
    if ((bVar2) && (bVar2 = is_xpath_attribute(local_40), pxVar1 = a_local, bVar2)) {
      xml_attribute::xml_attribute(&local_98,(xml_attribute_struct *)parent_local);
      xml_node::xml_node(&local_a0,(xml_node_struct *)alloc_local);
      xpath_node::xpath_node(&local_90,&local_98,&local_a0);
      xpath_node_set_raw::push_back((xpath_node_set_raw *)pxVar1,&local_90,(xpath_allocator *)name);
      return true;
    }
  }
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}